

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::TraceRaysIndirect
          (DeviceContextVkImpl *this,TraceRaysIndirectAttribs *Attribs)

{
  Uint32 *pUVar1;
  Uint64 UVar2;
  ShaderBindingTableVkImpl *pSVar3;
  BufferVkImpl *this_00;
  VkDeviceAddress VVar4;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::TraceRaysIndirect
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  pSVar3 = ClassPtrCast<Diligent::ShaderBindingTableVkImpl_const,Diligent::IShaderBindingTable_const>
                     (Attribs->pSBT);
  this_00 = PrepareIndirectAttribsBuffer
                      (this,Attribs->pAttribsBuffer,Attribs->AttribsBufferStateTransitionMode,
                       "Trace rays indirect (DeviceContextVkImpl::TraceRaysIndirect)");
  UVar2 = Attribs->ArgsByteOffset;
  PrepareForRayTracing(this);
  VVar4 = BufferVkImpl::GetVkDeviceAddress(this_00);
  VulkanUtilities::VulkanCommandBuffer::TraceRaysIndirect
            (&this->m_CommandBuffer,&(pSVar3->m_VkBindingTable).RaygenShader,
             &(pSVar3->m_VkBindingTable).MissShader,&(pSVar3->m_VkBindingTable).HitShader,
             &(pSVar3->m_VkBindingTable).CallableShader,UVar2 + VVar4 + 0x58);
  pUVar1 = &(this->m_State).NumCommands;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

void DeviceContextVkImpl::TraceRaysIndirect(const TraceRaysIndirectAttribs& Attribs)
{
    TDeviceContextBase::TraceRaysIndirect(Attribs, 0);

    const ShaderBindingTableVkImpl* pSBTVk       = ClassPtrCast<const ShaderBindingTableVkImpl>(Attribs.pSBT);
    const BindingTableVk&           BindingTable = pSBTVk->GetVkBindingTable();

    BufferVkImpl* const pIndirectAttribsVk = PrepareIndirectAttribsBuffer(Attribs.pAttribsBuffer, Attribs.AttribsBufferStateTransitionMode, "Trace rays indirect (DeviceContextVkImpl::TraceRaysIndirect)");
    const Uint64        IndirectBuffOffset = Attribs.ArgsByteOffset + TraceRaysIndirectCommandSBTSize;

    PrepareForRayTracing();
    m_CommandBuffer.TraceRaysIndirect(BindingTable.RaygenShader, BindingTable.MissShader, BindingTable.HitShader, BindingTable.CallableShader,
                                      pIndirectAttribsVk->GetVkDeviceAddress() + IndirectBuffOffset);
    ++m_State.NumCommands;
}